

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ValidPadding * __thiscall
CoreML::Specification::PoolingLayerParams::mutable_valid(PoolingLayerParams *this)

{
  bool bVar1;
  ValidPadding *this_00;
  PoolingLayerParams *this_local;
  
  bVar1 = has_valid(this);
  if (!bVar1) {
    clear_PoolingPaddingType(this);
    set_has_valid(this);
    this_00 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_00);
    (this->PoolingPaddingType_).valid_ = this_00;
  }
  return (this->PoolingPaddingType_).valid_;
}

Assistant:

inline ::CoreML::Specification::ValidPadding* PoolingLayerParams::mutable_valid() {
  if (!has_valid()) {
    clear_PoolingPaddingType();
    set_has_valid();
    PoolingPaddingType_.valid_ = new ::CoreML::Specification::ValidPadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.PoolingLayerParams.valid)
  return PoolingPaddingType_.valid_;
}